

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall
QMdiAreaPrivate::emitWindowActivated(QMdiAreaPrivate *this,QMdiSubWindow *activeWindow)

{
  long lVar1;
  bool bVar2;
  int index_00;
  int iVar3;
  QMdiAreaPrivate *this_00;
  qsizetype qVar4;
  qsizetype qVar5;
  QWidget *this_01;
  QWidget *in_RSI;
  QMdiAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  int index;
  QMdiArea *q;
  int indexToActiveWindow;
  QMdiAreaPrivate *in_stack_00000058;
  QMdiSubWindow *in_stack_ffffffffffffffb8;
  QListSpecialMethodsBase<int> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  QMdiAreaPrivate *this_02;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RDI;
  this_00 = (QMdiAreaPrivate *)q_func(in_RDI);
  bVar2 = ::operator==((QMdiSubWindow **)in_stack_ffffffffffffffc0,
                       (QPointer<QMdiSubWindow> *)in_stack_ffffffffffffffb8);
  if (!bVar2) {
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMdiSubWindow> *)0x60e746);
    if (!bVar2) {
      _q_deactivateAllWindows
                (this_00,(QMdiSubWindow *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    }
    if ((in_RDI->showActiveWindowMaximized & 1U) != 0) {
      bVar2 = QWidget::isMaximized(in_RSI);
      if (!bVar2) {
        QWidget::showMaximized((QWidget *)in_RDI);
      }
      in_RDI->showActiveWindowMaximized = false;
    }
    qVar4 = QListSpecialMethodsBase<QPointer<QMdiSubWindow>>::indexOf<QMdiSubWindow*>
                      ((QListSpecialMethodsBase<QPointer<QMdiSubWindow>_> *)
                       in_stack_ffffffffffffffc0,(QMdiSubWindow **)in_stack_ffffffffffffffb8,
                       0x60e7a5);
    qVar5 = QListSpecialMethodsBase<int>::indexOf<int>
                      (in_stack_ffffffffffffffc0,(int *)in_stack_ffffffffffffffb8,0x60e7c3);
    index_00 = (int)qVar5;
    QList<int>::move((QList<int> *)CONCAT44(index_00,in_stack_ffffffffffffffd0),(qsizetype)in_RDI,
                     (qsizetype)in_stack_ffffffffffffffc0);
    internalRaise(this_02,(QMdiSubWindow *)this_00);
    if ((in_RDI->updatesDisabledByUs & 1U) != 0) {
      QWidget::setUpdatesEnabled
                ((QWidget *)CONCAT44(index_00,in_stack_ffffffffffffffd0),
                 SUB81((ulong)in_RDI >> 0x38,0));
      in_RDI->updatesDisabledByUs = false;
    }
    QPointer<QMdiSubWindow>::operator=
              ((QPointer<QMdiSubWindow> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    QPointer<QMdiSubWindow>::operator=
              ((QPointer<QMdiSubWindow> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if ((in_RDI->tabBar != (QMdiAreaTabBar *)0x0) &&
       (iVar3 = QTabBar::currentIndex((QTabBar *)in_stack_ffffffffffffffb8), iVar3 != (int)qVar4)) {
      QTabBar::setCurrentIndex((QTabBar *)this_00,index_00);
    }
    this_01 = &QPointer<QMdiSubWindow>::operator->((QPointer<QMdiSubWindow> *)0x60e890)->
               super_QWidget;
    bVar2 = QWidget::isMaximized(this_01);
    if ((bVar2) && (bVar2 = scrollBarsEnabled(in_RDI), bVar2)) {
      updateScrollBars(in_stack_00000058);
    }
    ::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x60e8d3);
    QMdiArea::subWindowActivated((QMdiArea *)0x60e8e0,in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::emitWindowActivated(QMdiSubWindow *activeWindow)
{
    Q_Q(QMdiArea);
    Q_ASSERT(activeWindow);
    if (activeWindow == active)
        return;
    Q_ASSERT(activeWindow->d_func()->isActive);

    if (!aboutToBecomeActive)
        _q_deactivateAllWindows(activeWindow);
    Q_ASSERT(aboutToBecomeActive);

    // This is true only if 'DontMaximizeSubWindowOnActivation' is disabled
    // and the previous active window was maximized.
    if (showActiveWindowMaximized) {
        if (!activeWindow->isMaximized())
            activeWindow->showMaximized();
        showActiveWindowMaximized = false;
    }

    // Put in front to update activation order.
    const int indexToActiveWindow = childWindows.indexOf(activeWindow);
    Q_ASSERT(indexToActiveWindow != -1);
    const int index = indicesToActivatedChildren.indexOf(indexToActiveWindow);
    Q_ASSERT(index != -1);
    indicesToActivatedChildren.move(index, 0);
    internalRaise(activeWindow);

    if (updatesDisabledByUs) {
        q->setUpdatesEnabled(true);
        updatesDisabledByUs = false;
    }

    Q_ASSERT(aboutToBecomeActive == activeWindow);
    active = activeWindow;
    aboutToBecomeActive = nullptr;
    Q_ASSERT(active->d_func()->isActive);

#if QT_CONFIG(tabbar)
    if (tabBar && tabBar->currentIndex() != indexToActiveWindow)
        tabBar->setCurrentIndex(indexToActiveWindow);
#endif

    if (active->isMaximized() && scrollBarsEnabled())
        updateScrollBars();

    emit q->subWindowActivated(active);
}